

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.h
# Opt level: O0

ssize_t __thiscall Deserializer::read(Deserializer *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  undefined4 in_register_00000034;
  String local_c8;
  Log local_98;
  Log local_88;
  Log local_78;
  Log local_68;
  Log local_58;
  String local_48;
  uint local_24;
  void *pvStack_20;
  int len_local;
  void *target_local;
  Deserializer *this_local;
  
  pvStack_20 = (void *)CONCAT44(in_register_00000034,__fd);
  local_24 = (uint)__buf;
  target_local = this;
  if (read(void*,int)::dump == '\0') {
    iVar1 = __cxa_guard_acquire(&read(void*,int)::dump);
    if (iVar1 != 0) {
      pcVar2 = getenv("RCT_SERIALIZER_DUMP");
      read::dump = pcVar2 != (char *)0x0;
      __cxa_guard_release(&read(void*,int)::dump);
    }
  }
  if ((read::dump & 1U) != 0) {
    printf("Reading %d bytes for %s\n",(ulong)local_24,this->mKey);
  }
  if (local_24 == 0) {
    this_local._4_4_ = 0;
  }
  else if (this->mData == (char *)0x0) {
    if (this->mFile == (FILE *)0x0) {
      __assert_fail("mFile",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Serializer.h"
                    ,0xb9,"int Deserializer::read(void *, int)");
    }
    sVar3 = fread(pvStack_20,1,(long)(int)local_24,(FILE *)this->mFile);
    this_local._4_4_ = (uint)sVar3;
  }
  else {
    if (this->mLength < (int)(this->mPos + local_24)) {
      ::error();
      Log::operator<<(&local_88,(char *)&local_98);
      Log::operator<<(&local_78,(int32_t)&local_88);
      Log::operator<<(&local_68,(int32_t)&local_78);
      Log::operator<<(&local_58,(int32_t)&local_68);
      Log::operator<<((Log *)&local_48,(char)&local_58);
      Rct::backtrace(&local_c8,-1);
      ::operator<<((Log *)&local_48.mString.field_2,&local_48);
      Log::~Log((Log *)&local_48.mString.field_2);
      String::~String(&local_c8);
      Log::~Log((Log *)&local_48);
      Log::~Log(&local_58);
      Log::~Log(&local_68);
      Log::~Log(&local_78);
      Log::~Log(&local_88);
      Log::~Log(&local_98);
    }
    if (this->mLength < (int)(this->mPos + local_24)) {
      __assert_fail("mPos + len <= mLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Serializer.h"
                    ,0xb4,"int Deserializer::read(void *, int)");
    }
    memcpy(pvStack_20,this->mData + this->mPos,(long)(int)local_24);
    this->mPos = local_24 + this->mPos;
    this_local._4_4_ = local_24;
  }
  return (ulong)this_local._4_4_;
}

Assistant:

int read(void *target, int len)
    {
        static const bool dump = getenv("RCT_SERIALIZER_DUMP");
        if (dump) {
            printf("Reading %d bytes for %s\n", len, mKey);
        }
        if (len) {
            if (mData) {
                if (mPos + len > mLength) {
                    error() << "About to die" << mPos << len << mLength << '\n' << Rct::backtrace();

                }
                assert(mPos + len <= mLength);
                memcpy(target, mData + mPos, len);
                mPos += len;
                return len;
            } else {
                assert(mFile);
                return fread(target, sizeof(char), len, mFile);
            }
        }
        return 0;
    }